

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O1

edata_t * duckdb_je_edata_avail_remove_first(edata_avail_t *ph)

{
  long lVar1;
  edata_t *peVar2;
  void *pvVar3;
  uintptr_t a_eaddr;
  void *pvVar4;
  uintptr_t a_eaddr_1;
  void *pvVar5;
  ulong uVar6;
  uintptr_t b_eaddr;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  uintptr_t b_eaddr_2;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  
  pvVar4 = (ph->ph).root;
  if (pvVar4 == (void *)0x0) {
    return (edata_t *)0x0;
  }
  (ph->ph).auxcount = 0;
  uVar9 = *(ulong *)((long)pvVar4 + 0x30);
  if (uVar9 != 0) {
    *(undefined8 *)((long)pvVar4 + 0x28) = 0;
    *(undefined8 *)((long)pvVar4 + 0x30) = 0;
    *(undefined8 *)(uVar9 + 0x28) = 0;
    uVar11 = *(ulong *)(uVar9 + 0x30);
    if (uVar11 != 0) {
      uVar12 = *(ulong *)(uVar11 + 0x30);
      if (uVar12 != 0) {
        *(undefined8 *)(uVar12 + 0x28) = 0;
      }
      *(undefined8 *)(uVar9 + 0x28) = 0;
      *(undefined8 *)(uVar9 + 0x30) = 0;
      *(undefined8 *)(uVar11 + 0x28) = 0;
      *(undefined8 *)(uVar11 + 0x30) = 0;
      uVar10 = *(ulong *)(uVar9 + 0x10) & 0xfff;
      uVar8 = *(ulong *)(uVar11 + 0x10) & 0xfff;
      if ((int)(((uint)(uVar8 < uVar10) - (uint)(uVar10 < uVar8)) * 2 - (uint)(uVar9 < uVar11)) < 0)
      {
        *(ulong *)(uVar11 + 0x28) = uVar9;
        lVar1 = *(long *)(uVar9 + 0x38);
        *(long *)(uVar11 + 0x30) = lVar1;
        if (lVar1 != 0) {
          *(ulong *)(lVar1 + 0x28) = uVar11;
        }
        *(ulong *)(uVar9 + 0x38) = uVar11;
        uVar11 = uVar9;
      }
      else {
        *(ulong *)(uVar9 + 0x28) = uVar11;
        lVar1 = *(long *)(uVar11 + 0x38);
        *(long *)(uVar9 + 0x30) = lVar1;
        if (lVar1 != 0) {
          *(ulong *)(lVar1 + 0x28) = uVar9;
        }
        *(ulong *)(uVar11 + 0x38) = uVar9;
        uVar9 = uVar11;
      }
      while (uVar8 = uVar12, uVar8 != 0) {
        uVar10 = *(ulong *)(uVar8 + 0x30);
        if (uVar10 == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = *(ulong *)(uVar10 + 0x30);
          if (uVar12 != 0) {
            *(undefined8 *)(uVar12 + 0x28) = 0;
          }
          *(undefined8 *)(uVar8 + 0x28) = 0;
          *(undefined8 *)(uVar8 + 0x30) = 0;
          *(undefined8 *)(uVar10 + 0x28) = 0;
          *(undefined8 *)(uVar10 + 0x30) = 0;
          uVar14 = *(ulong *)(uVar8 + 0x10) & 0xfff;
          uVar6 = *(ulong *)(uVar10 + 0x10) & 0xfff;
          if ((int)(((uint)(uVar6 < uVar14) - (uint)(uVar14 < uVar6)) * 2 - (uint)(uVar8 < uVar10))
              < 0) {
            *(ulong *)(uVar10 + 0x28) = uVar8;
            lVar1 = *(long *)(uVar8 + 0x38);
            *(long *)(uVar10 + 0x30) = lVar1;
            if (lVar1 != 0) {
              *(ulong *)(lVar1 + 0x28) = uVar10;
            }
            *(ulong *)(uVar8 + 0x38) = uVar10;
          }
          else {
            *(ulong *)(uVar8 + 0x28) = uVar10;
            lVar1 = *(long *)(uVar10 + 0x38);
            *(long *)(uVar8 + 0x30) = lVar1;
            if (lVar1 != 0) {
              *(ulong *)(lVar1 + 0x28) = uVar8;
            }
            *(ulong *)(uVar10 + 0x38) = uVar8;
            uVar8 = uVar10;
          }
        }
        *(ulong *)(uVar11 + 0x30) = uVar8;
        uVar11 = uVar8;
      }
      uVar8 = *(ulong *)(uVar9 + 0x30);
      uVar12 = uVar9;
      if (uVar8 != 0) {
        while( true ) {
          uVar9 = uVar12;
          uVar12 = *(ulong *)(uVar8 + 0x30);
          *(undefined8 *)(uVar9 + 0x30) = 0;
          *(undefined8 *)(uVar8 + 0x30) = 0;
          if (uVar8 != 0) {
            uVar6 = *(ulong *)(uVar9 + 0x10) & 0xfff;
            uVar10 = *(ulong *)(uVar8 + 0x10) & 0xfff;
            if ((int)(((uint)(uVar10 < uVar6) - (uint)(uVar6 < uVar10)) * 2 - (uint)(uVar9 < uVar8))
                < 0) {
              *(ulong *)(uVar8 + 0x28) = uVar9;
              lVar1 = *(long *)(uVar9 + 0x38);
              *(long *)(uVar8 + 0x30) = lVar1;
              if (lVar1 != 0) {
                *(ulong *)(lVar1 + 0x28) = uVar8;
              }
              *(ulong *)(uVar9 + 0x38) = uVar8;
            }
            else {
              *(ulong *)(uVar9 + 0x28) = uVar8;
              lVar1 = *(long *)(uVar8 + 0x38);
              *(long *)(uVar9 + 0x30) = lVar1;
              if (lVar1 != 0) {
                *(ulong *)(lVar1 + 0x28) = uVar9;
              }
              *(ulong *)(uVar8 + 0x38) = uVar9;
              uVar9 = uVar8;
            }
          }
          if (uVar12 == 0) break;
          *(ulong *)(uVar11 + 0x30) = uVar9;
          uVar8 = *(ulong *)(uVar12 + 0x30);
          uVar11 = uVar9;
        }
      }
    }
    *(void **)(uVar9 + 0x28) = pvVar4;
    lVar1 = *(long *)((long)pvVar4 + 0x38);
    *(long *)(uVar9 + 0x30) = lVar1;
    if (lVar1 != 0) {
      *(ulong *)(lVar1 + 0x28) = uVar9;
    }
    *(ulong *)((long)pvVar4 + 0x38) = uVar9;
  }
  peVar2 = (edata_t *)(ph->ph).root;
  pvVar4 = *(void **)((long)&peVar2->field_5 + 0x10);
  if (pvVar4 == (void *)0x0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar7 = *(void **)((long)pvVar4 + 0x30);
    if (pvVar7 != (void *)0x0) {
      pvVar13 = *(void **)((long)pvVar7 + 0x30);
      if (pvVar13 != (void *)0x0) {
        *(undefined8 *)((long)pvVar13 + 0x28) = 0;
      }
      *(undefined8 *)((long)pvVar4 + 0x28) = 0;
      *(undefined8 *)((long)pvVar4 + 0x30) = 0;
      *(undefined8 *)((long)pvVar7 + 0x28) = 0;
      *(undefined8 *)((long)pvVar7 + 0x30) = 0;
      uVar11 = *(ulong *)((long)pvVar4 + 0x10) & 0xfff;
      uVar9 = *(ulong *)((long)pvVar7 + 0x10) & 0xfff;
      if ((int)(((uint)(uVar9 < uVar11) - (uint)(uVar11 < uVar9)) * 2 - (uint)(pvVar4 < pvVar7)) < 0
         ) {
        *(void **)((long)pvVar7 + 0x28) = pvVar4;
        lVar1 = *(long *)((long)pvVar4 + 0x38);
        *(long *)((long)pvVar7 + 0x30) = lVar1;
        if (lVar1 != 0) {
          *(void **)(lVar1 + 0x28) = pvVar7;
        }
        *(void **)((long)pvVar4 + 0x38) = pvVar7;
        pvVar7 = pvVar4;
      }
      else {
        *(void **)((long)pvVar4 + 0x28) = pvVar7;
        lVar1 = *(long *)((long)pvVar7 + 0x38);
        *(long *)((long)pvVar4 + 0x30) = lVar1;
        if (lVar1 != 0) {
          *(void **)(lVar1 + 0x28) = pvVar4;
        }
        *(void **)((long)pvVar7 + 0x38) = pvVar4;
        pvVar4 = pvVar7;
      }
      while (pvVar5 = pvVar13, pvVar5 != (void *)0x0) {
        pvVar3 = *(void **)((long)pvVar5 + 0x30);
        if (pvVar3 == (void *)0x0) {
          pvVar13 = (void *)0x0;
        }
        else {
          pvVar13 = *(void **)((long)pvVar3 + 0x30);
          if (pvVar13 != (void *)0x0) {
            *(undefined8 *)((long)pvVar13 + 0x28) = 0;
          }
          *(undefined8 *)((long)pvVar5 + 0x28) = 0;
          *(undefined8 *)((long)pvVar5 + 0x30) = 0;
          *(undefined8 *)((long)pvVar3 + 0x28) = 0;
          *(undefined8 *)((long)pvVar3 + 0x30) = 0;
          uVar11 = *(ulong *)((long)pvVar5 + 0x10) & 0xfff;
          uVar9 = *(ulong *)((long)pvVar3 + 0x10) & 0xfff;
          if ((int)(((uint)(uVar9 < uVar11) - (uint)(uVar11 < uVar9)) * 2 - (uint)(pvVar5 < pvVar3))
              < 0) {
            *(void **)((long)pvVar3 + 0x28) = pvVar5;
            lVar1 = *(long *)((long)pvVar5 + 0x38);
            *(long *)((long)pvVar3 + 0x30) = lVar1;
            if (lVar1 != 0) {
              *(void **)(lVar1 + 0x28) = pvVar3;
            }
            *(void **)((long)pvVar5 + 0x38) = pvVar3;
          }
          else {
            *(void **)((long)pvVar5 + 0x28) = pvVar3;
            lVar1 = *(long *)((long)pvVar3 + 0x38);
            *(long *)((long)pvVar5 + 0x30) = lVar1;
            if (lVar1 != 0) {
              *(void **)(lVar1 + 0x28) = pvVar5;
            }
            *(void **)((long)pvVar3 + 0x38) = pvVar5;
            pvVar5 = pvVar3;
          }
        }
        *(void **)((long)pvVar7 + 0x30) = pvVar5;
        pvVar7 = pvVar5;
      }
      pvVar5 = *(void **)((long)pvVar4 + 0x30);
      pvVar13 = pvVar4;
      if (pvVar5 != (void *)0x0) {
        while( true ) {
          pvVar4 = pvVar13;
          pvVar13 = *(void **)((long)pvVar5 + 0x30);
          *(undefined8 *)((long)pvVar4 + 0x30) = 0;
          *(undefined8 *)((long)pvVar5 + 0x30) = 0;
          if (pvVar5 != (void *)0x0) {
            uVar11 = *(ulong *)((long)pvVar4 + 0x10) & 0xfff;
            uVar9 = *(ulong *)((long)pvVar5 + 0x10) & 0xfff;
            if ((int)(((uint)(uVar9 < uVar11) - (uint)(uVar11 < uVar9)) * 2 -
                     (uint)(pvVar4 < pvVar5)) < 0) {
              *(void **)((long)pvVar5 + 0x28) = pvVar4;
              lVar1 = *(long *)((long)pvVar4 + 0x38);
              *(long *)((long)pvVar5 + 0x30) = lVar1;
              if (lVar1 != 0) {
                *(void **)(lVar1 + 0x28) = pvVar5;
              }
              *(void **)((long)pvVar4 + 0x38) = pvVar5;
            }
            else {
              *(void **)((long)pvVar4 + 0x28) = pvVar5;
              lVar1 = *(long *)((long)pvVar5 + 0x38);
              *(long *)((long)pvVar4 + 0x30) = lVar1;
              if (lVar1 != 0) {
                *(void **)(lVar1 + 0x28) = pvVar4;
              }
              *(void **)((long)pvVar5 + 0x38) = pvVar4;
              pvVar4 = pvVar5;
            }
          }
          if (pvVar13 == (void *)0x0) break;
          *(void **)((long)pvVar7 + 0x30) = pvVar4;
          pvVar5 = *(void **)((long)pvVar13 + 0x30);
          pvVar7 = pvVar4;
        }
      }
    }
  }
  (ph->ph).root = pvVar4;
  return peVar2;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_remove_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	void *ret;

	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	ret = ph->root;
	ph->root = ph_merge_children(ph->root, offset, cmp);

	return ret;

}